

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadTorus.h
# Opt level: O3

void __thiscall
pzgeom::TPZQuadTorus::TPZQuadTorus(TPZQuadTorus *this,TPZQuadTorus *cp,TPZGeoMesh *param_2)

{
  ulong uVar1;
  double *pdVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  REAL RVar6;
  double *pdVar7;
  ulong uVar8;
  
  (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_0189d1f0;
  iVar3 = (cp->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[1];
  iVar4 = (cp->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[2];
  iVar5 = (cp->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[3];
  (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[0] =
       (cp->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[0];
  (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[1] = iVar3
  ;
  (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[2] = iVar4
  ;
  (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[3] = iVar5
  ;
  (this->super_TPZGeoQuad).super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZQuadTorus_0189d0f8;
  RVar6 = cp->fr;
  this->fR = cp->fR;
  this->fr = RVar6;
  (this->fOrigin).super_TPZVec<double>.fStore = (double *)0x0;
  (this->fOrigin).super_TPZVec<double>.fNElements = 0;
  (this->fOrigin).super_TPZVec<double>.fNAlloc = 0;
  (this->fOrigin).super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181a198;
  uVar1 = (cp->fOrigin).super_TPZVec<double>.fNElements;
  if ((long)uVar1 < 0xb) {
    pdVar7 = (this->fOrigin).fExtAlloc;
    (this->fOrigin).super_TPZVec<double>.fStore = pdVar7;
    (this->fOrigin).super_TPZVec<double>.fNElements = uVar1;
    (this->fOrigin).super_TPZVec<double>.fNAlloc = 0;
    if ((long)uVar1 < 1) goto LAB_00efb9ea;
  }
  else {
    pdVar7 = (double *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    (this->fOrigin).super_TPZVec<double>.fStore = pdVar7;
    (this->fOrigin).super_TPZVec<double>.fNElements = uVar1;
    (this->fOrigin).super_TPZVec<double>.fNAlloc = uVar1;
  }
  pdVar2 = (cp->fOrigin).super_TPZVec<double>.fStore;
  uVar8 = 0;
  do {
    pdVar7[uVar8] = pdVar2[uVar8];
    uVar8 = uVar8 + 1;
  } while (uVar1 != uVar8);
LAB_00efb9ea:
  pdVar7 = (this->fPhiTheta).fBuf;
  (this->fPhiTheta).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fPhiTheta).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fPhiTheta).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  (this->fPhiTheta).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  (this->fPhiTheta).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018874b0;
  (this->fPhiTheta).super_TPZFMatrix<double>.fElem = pdVar7;
  (this->fPhiTheta).super_TPZFMatrix<double>.fGiven = pdVar7;
  (this->fPhiTheta).super_TPZFMatrix<double>.fSize = 0xc;
  TPZVec<int>::TPZVec(&(this->fPhiTheta).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
  (this->fPhiTheta).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (this->fPhiTheta).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
       (this->fPhiTheta).super_TPZFMatrix<double>.fPivot.fExtAlloc;
  (this->fPhiTheta).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fPhiTheta).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fPhiTheta).super_TPZFMatrix<double>.fWork._vptr_TPZVec =
       (_func_int **)&PTR__TPZVec_01813df0;
  (this->fPhiTheta).super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
  (this->fPhiTheta).super_TPZFMatrix<double>.fWork.fNElements = 0;
  (this->fPhiTheta).super_TPZFMatrix<double>.fWork.fNAlloc = 0;
  (this->fPhiTheta).super_TPZFMatrix<double>.fElem = (double *)0x0;
  (this->fPhiTheta).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_018871c0;
  TPZFMatrix<double>::operator=
            (&(this->fPhiTheta).super_TPZFMatrix<double>,&(cp->fPhiTheta).super_TPZFMatrix<double>);
  return;
}

Assistant:

TPZQuadTorus(const TPZQuadTorus &cp, TPZGeoMesh &) : TPZGeoQuad(cp), fR(cp.fR), fr(cp.fr), fOrigin(cp.fOrigin), fPhiTheta(cp.fPhiTheta)
		{
		}